

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

TValue * lj_meta_equal(lua_State *L,GCobj *o1,GCobj *o2,int ne)

{
  byte bVar1;
  uint uVar2;
  cTValue *pcVar3;
  cTValue *pcVar4;
  ulong uVar5;
  TValue *pTVar6;
  code *pcVar7;
  GCtab *pGVar8;
  
  pGVar8 = (GCtab *)(ulong)(o1->gch).metatable.gcptr32;
  if (((pGVar8 != (GCtab *)0x0) && ((pGVar8->nomm & 0x10) == 0)) &&
     (pcVar3 = lj_meta_cache(pGVar8,MM_eq,(GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x110)
                            ), pcVar3 != (cTValue *)0x0)) {
    uVar2 = (o2->gch).metatable.gcptr32;
    pGVar8 = (GCtab *)(ulong)uVar2;
    if ((o1->gch).metatable.gcptr32 == uVar2) goto LAB_0010b6f8;
    if (((pGVar8 == (GCtab *)0x0) || ((pGVar8->nomm & 0x10) != 0)) ||
       (pcVar4 = lj_meta_cache(pGVar8,MM_eq,
                               (GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x110)),
       pcVar4 == (cTValue *)0x0)) goto LAB_0010b7cd;
    uVar2 = (pcVar3->field_2).it;
    if (uVar2 == (pcVar4->field_2).it) {
      if (0xfffffffc < uVar2) goto LAB_0010b6f8;
      if (0xfffefffe < uVar2) {
        if ((pcVar3->u32).lo != (pcVar4->u32).lo) goto LAB_0010b7cd;
        goto LAB_0010b6f8;
      }
    }
    else if ((0xfffeffff < uVar2) || (0xfffeffff < (pcVar4->field_2).it)) goto LAB_0010b7cd;
    if ((pcVar3->n == pcVar4->n) && (!NAN(pcVar3->n) && !NAN(pcVar4->n))) {
LAB_0010b6f8:
      uVar5 = (ulong)L->base[-1].u32.lo;
      if (*(char *)(uVar5 + 6) == '\0') {
        pTVar6 = L->base + *(byte *)((ulong)*(uint *)(uVar5 + 0x10) - 0x39);
      }
      else {
        pTVar6 = L->top;
      }
      pcVar7 = lj_cont_condf;
      if (ne == 0) {
        pcVar7 = lj_cont_condt;
      }
      pTVar6->u64 = (uint64_t)(pcVar7 + -0x14dad0);
      pTVar6[1].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pcVar3;
      bVar1 = (o1->gch).gct;
      pTVar6[2].u32.lo = (uint32_t)o1;
      *(uint *)((long)pTVar6 + 0x14) = ~(uint)bVar1;
      pTVar6[3].u32.lo = (uint32_t)o2;
      *(uint *)((long)pTVar6 + 0x1c) = ~(uint)bVar1;
      return pTVar6 + 2;
    }
  }
LAB_0010b7cd:
  return (TValue *)(long)ne;
}

Assistant:

TValue *lj_meta_equal(lua_State *L, GCobj *o1, GCobj *o2, int ne)
{
  /* Field metatable must be at same offset for GCtab and GCudata! */
  cTValue *mo = lj_meta_fast(L, tabref(o1->gch.metatable), MM_eq);
  if (mo) {
    TValue *top;
    uint32_t it;
    if (tabref(o1->gch.metatable) != tabref(o2->gch.metatable)) {
      cTValue *mo2 = lj_meta_fast(L, tabref(o2->gch.metatable), MM_eq);
      if (mo2 == NULL || !lj_obj_equal(mo, mo2))
	return (TValue *)(intptr_t)ne;
    }
    top = curr_top(L);
    setcont(top, ne ? lj_cont_condf : lj_cont_condt);
    copyTV(L, top+1, mo);
    it = ~(uint32_t)o1->gch.gct;
    setgcV(L, top+2, o1, it);
    setgcV(L, top+3, o2, it);
    return top+2;  /* Trigger metamethod call. */
  }
  return (TValue *)(intptr_t)ne;
}